

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PcacheFetchStress(PCache *pCache,Pgno pgno,sqlite3_pcache_page **ppPage)

{
  int iVar1;
  sqlite3_pcache_page *psVar2;
  bool bVar3;
  PgHdr *pPStack_30;
  int rc;
  PgHdr *pPg;
  sqlite3_pcache_page **ppPage_local;
  Pgno pgno_local;
  PCache *pCache_local;
  
  if (pCache->eCreate == '\x02') {
    pCache_local._4_4_ = 0;
  }
  else {
    iVar1 = sqlite3PcachePagecount(pCache);
    if (pCache->szSpill < iVar1) {
      pPStack_30 = pCache->pSynced;
      while( true ) {
        bVar3 = false;
        if ((pPStack_30 != (PgHdr *)0x0) && (bVar3 = true, pPStack_30->nRef == 0)) {
          bVar3 = (pPStack_30->flags & 8) != 0;
        }
        if (!bVar3) break;
        pPStack_30 = pPStack_30->pDirtyPrev;
      }
      pCache->pSynced = pPStack_30;
      if (pPStack_30 == (PgHdr *)0x0) {
        pPStack_30 = pCache->pDirtyTail;
        while( true ) {
          bVar3 = false;
          if (pPStack_30 != (PgHdr *)0x0) {
            bVar3 = pPStack_30->nRef != 0;
          }
          if (!bVar3) break;
          pPStack_30 = pPStack_30->pDirtyPrev;
        }
      }
      if (((pPStack_30 != (PgHdr *)0x0) &&
          (iVar1 = (*pCache->xStress)(pCache->pStress,pPStack_30), iVar1 != 0)) && (iVar1 != 5)) {
        return iVar1;
      }
    }
    psVar2 = (*sqlite3Config.pcache2.xFetch)(pCache->pCache,pgno,2);
    *ppPage = psVar2;
    pCache_local._4_4_ = 0;
    if (*ppPage == (sqlite3_pcache_page *)0x0) {
      pCache_local._4_4_ = 7;
    }
  }
  return pCache_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheFetchStress(
  PCache *pCache,                 /* Obtain the page from this cache */
  Pgno pgno,                      /* Page number to obtain */
  sqlite3_pcache_page **ppPage    /* Write result here */
){
  PgHdr *pPg;
  if( pCache->eCreate==2 ) return 0;

  if( sqlite3PcachePagecount(pCache)>pCache->szSpill ){
    /* Find a dirty page to write-out and recycle. First try to find a 
    ** page that does not require a journal-sync (one with PGHDR_NEED_SYNC
    ** cleared), but if that is not possible settle for any other 
    ** unreferenced dirty page.
    **
    ** If the LRU page in the dirty list that has a clear PGHDR_NEED_SYNC
    ** flag is currently referenced, then the following may leave pSynced
    ** set incorrectly (pointing to other than the LRU page with NEED_SYNC
    ** cleared). This is Ok, as pSynced is just an optimization.  */
    for(pPg=pCache->pSynced; 
        pPg && (pPg->nRef || (pPg->flags&PGHDR_NEED_SYNC)); 
        pPg=pPg->pDirtyPrev
    );
    pCache->pSynced = pPg;
    if( !pPg ){
      for(pPg=pCache->pDirtyTail; pPg && pPg->nRef; pPg=pPg->pDirtyPrev);
    }
    if( pPg ){
      int rc;
#ifdef SQLITE_LOG_CACHE_SPILL
      sqlite3_log(SQLITE_FULL, 
                  "spill page %d making room for %d - cache used: %d/%d",
                  pPg->pgno, pgno,
                  sqlite3GlobalConfig.pcache2.xPagecount(pCache->pCache),
                numberOfCachePages(pCache));
#endif
      pcacheTrace(("%p.SPILL %d\n",pCache,pPg->pgno));
      rc = pCache->xStress(pCache->pStress, pPg);
      pcacheDump(pCache);
      if( rc!=SQLITE_OK && rc!=SQLITE_BUSY ){
        return rc;
      }
    }
  }
  *ppPage = sqlite3GlobalConfig.pcache2.xFetch(pCache->pCache, pgno, 2);
  return *ppPage==0 ? SQLITE_NOMEM_BKPT : SQLITE_OK;
}